

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

bool __thiscall cs::structure::operator==(structure *this,structure *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  element_type *peVar3;
  domain_type *this_00;
  char *pcVar4;
  proxy *ppVar5;
  any aVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  bool bVar23;
  int iVar24;
  size_t sVar25;
  var *pvVar26;
  bool *pbVar27;
  uint uVar28;
  undefined1 uVar29;
  char *pcVar30;
  value_type *it;
  slot_type *name;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  any aStack_78;
  any local_70;
  any local_68;
  key_arg<std::__cxx11::basic_string<char>_> local_60;
  structure *local_40;
  structure *local_38;
  
  if (this == s) {
LAB_00178a38:
    if (this->m_shadow == false) {
      peVar3 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"equal","");
      sVar25 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::count<std::__cxx11::string>
                         ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)peVar3,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (sVar25 != 0) {
        this_00 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"equal","");
        pvVar26 = domain_type::get_var(this_00,&local_60);
        local_38 = this;
        cs_impl::any::make<cs::structure,cs::structure_const*>(&local_70,&local_38);
        local_40 = s;
        cs_impl::any::make<cs::structure,cs::structure_const*>(&aStack_78,&local_40);
        invoke<cs_impl::any,cs_impl::any>((cs *)&local_68,pvVar26,&local_70,&aStack_78);
        pbVar27 = cs_impl::any::const_val<bool>(&local_68);
        bVar23 = *pbVar27;
        cs_impl::any::recycle(&local_68);
        cs_impl::any::recycle(&aStack_78);
        cs_impl::any::recycle(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == paVar1) {
          return bVar23;
        }
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        return bVar23;
      }
    }
    peVar3 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar4 = (peVar3->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    name = (peVar3->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .slots_;
    cVar2 = *pcVar4;
    pcVar30 = pcVar4;
    while (cVar2 < -1) {
      iVar24 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar30 < (char)iVar24);
      in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar24 >> 8));
      in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar24 >> 0x10));
      in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar24 >> 0x18));
      in_XMM1_Be = -(pcVar30[4] < (char)iVar12);
      in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -(pcVar30[8] < (char)iVar13);
      in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar14);
      in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar14 >> 0x18));
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar21[1] = in_XMM1_Bd;
      auVar21[0] = in_XMM1_Bc;
      auVar21[2] = in_XMM1_Be;
      auVar21[3] = in_XMM1_Bf;
      auVar21[4] = in_XMM1_Bg;
      auVar21[5] = in_XMM1_Bh;
      auVar21[6] = in_XMM1_Bi;
      auVar21[7] = in_XMM1_Bj;
      auVar21[8] = in_XMM1_Bk;
      auVar21[9] = in_XMM1_Bl;
      auVar21[10] = in_XMM1_Bm;
      auVar21[0xb] = in_XMM1_Bn;
      auVar21[0xc] = in_XMM1_Bo;
      auVar21[0xd] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Be;
      auVar19[0] = in_XMM1_Bd;
      auVar19[2] = in_XMM1_Bf;
      auVar19[3] = in_XMM1_Bg;
      auVar19[4] = in_XMM1_Bh;
      auVar19[5] = in_XMM1_Bi;
      auVar19[6] = in_XMM1_Bj;
      auVar19[7] = in_XMM1_Bk;
      auVar19[8] = in_XMM1_Bl;
      auVar19[9] = in_XMM1_Bm;
      auVar19[10] = in_XMM1_Bn;
      auVar19[0xb] = in_XMM1_Bo;
      auVar19[0xc] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Bf;
      auVar17[0] = in_XMM1_Be;
      auVar17[2] = in_XMM1_Bg;
      auVar17[3] = in_XMM1_Bh;
      auVar17[4] = in_XMM1_Bi;
      auVar17[5] = in_XMM1_Bj;
      auVar17[6] = in_XMM1_Bk;
      auVar17[7] = in_XMM1_Bl;
      auVar17[8] = in_XMM1_Bm;
      auVar17[9] = in_XMM1_Bn;
      auVar17[10] = in_XMM1_Bo;
      auVar17[0xb] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bg;
      auVar15[0] = in_XMM1_Bf;
      auVar15[2] = in_XMM1_Bh;
      auVar15[3] = in_XMM1_Bi;
      auVar15[4] = in_XMM1_Bj;
      auVar15[5] = in_XMM1_Bk;
      auVar15[6] = in_XMM1_Bl;
      auVar15[7] = in_XMM1_Bm;
      auVar15[8] = in_XMM1_Bn;
      auVar15[9] = in_XMM1_Bo;
      auVar15[10] = in_XMM1_Bp;
      uVar28 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar7 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      name = name + uVar7;
      cVar2 = pcVar30[uVar7];
      pcVar30 = pcVar30 + uVar7;
    }
    sVar25 = (peVar3->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    uVar29 = 1;
    if (pcVar30 != pcVar4 + sVar25) {
      do {
        iVar24 = std::__cxx11::string::compare((char *)name);
        if (iVar24 != 0) {
          pvVar26 = domain_type::get_var
                              ((s->m_data).
                               super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&(name->value).first);
          ppVar5 = pvVar26->mDat;
          aVar6.mDat = (((this->m_data).
                         super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(long)(&name->key)[1]._M_dataplus._M_p].mDat;
          if ((ppVar5 == (proxy *)0x0) || (aVar6.mDat == (proxy *)0x0)) {
            if (ppVar5 != (proxy *)0x0 || aVar6.mDat != (proxy *)0x0) goto LAB_00178c40;
          }
          else {
            iVar24 = (*ppVar5->data->_vptr_baseHolder[4])(ppVar5->data,(aVar6.mDat)->data);
            if ((char)iVar24 == '\0') goto LAB_00178c40;
          }
        }
        name = (slot_type *)&(&name->key)[1]._M_string_length;
        cVar2 = pcVar30[1];
        pcVar30 = pcVar30 + 1;
        while (cVar2 < -1) {
          iVar24 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                          == CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
          iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar30 < (char)iVar24);
          in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar24 >> 8));
          in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar24 >> 0x10));
          in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar24 >> 0x18));
          in_XMM1_Be = -(pcVar30[4] < (char)iVar12);
          in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar12 >> 8));
          in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar12 >> 0x10));
          in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar12 >> 0x18));
          in_XMM1_Bi = -(pcVar30[8] < (char)iVar13);
          in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar13 >> 8));
          in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar13 >> 0x10));
          in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar13 >> 0x18));
          in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar14);
          in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar14 >> 8));
          in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar14 >> 0x10));
          in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar14 >> 0x18));
          auVar10[1] = in_XMM1_Bb;
          auVar10[0] = in_XMM1_Ba;
          auVar10[2] = in_XMM1_Bc;
          auVar10[3] = in_XMM1_Bd;
          auVar10[4] = in_XMM1_Be;
          auVar10[5] = in_XMM1_Bf;
          auVar10[6] = in_XMM1_Bg;
          auVar10[7] = in_XMM1_Bh;
          auVar10[8] = in_XMM1_Bi;
          auVar10[9] = in_XMM1_Bj;
          auVar10[10] = in_XMM1_Bk;
          auVar10[0xb] = in_XMM1_Bl;
          auVar10[0xc] = in_XMM1_Bm;
          auVar10[0xd] = in_XMM1_Bn;
          auVar10[0xe] = in_XMM1_Bo;
          auVar10[0xf] = in_XMM1_Bp;
          auVar11[1] = in_XMM1_Bb;
          auVar11[0] = in_XMM1_Ba;
          auVar11[2] = in_XMM1_Bc;
          auVar11[3] = in_XMM1_Bd;
          auVar11[4] = in_XMM1_Be;
          auVar11[5] = in_XMM1_Bf;
          auVar11[6] = in_XMM1_Bg;
          auVar11[7] = in_XMM1_Bh;
          auVar11[8] = in_XMM1_Bi;
          auVar11[9] = in_XMM1_Bj;
          auVar11[10] = in_XMM1_Bk;
          auVar11[0xb] = in_XMM1_Bl;
          auVar11[0xc] = in_XMM1_Bm;
          auVar11[0xd] = in_XMM1_Bn;
          auVar11[0xe] = in_XMM1_Bo;
          auVar11[0xf] = in_XMM1_Bp;
          auVar22[1] = in_XMM1_Bd;
          auVar22[0] = in_XMM1_Bc;
          auVar22[2] = in_XMM1_Be;
          auVar22[3] = in_XMM1_Bf;
          auVar22[4] = in_XMM1_Bg;
          auVar22[5] = in_XMM1_Bh;
          auVar22[6] = in_XMM1_Bi;
          auVar22[7] = in_XMM1_Bj;
          auVar22[8] = in_XMM1_Bk;
          auVar22[9] = in_XMM1_Bl;
          auVar22[10] = in_XMM1_Bm;
          auVar22[0xb] = in_XMM1_Bn;
          auVar22[0xc] = in_XMM1_Bo;
          auVar22[0xd] = in_XMM1_Bp;
          auVar20[1] = in_XMM1_Be;
          auVar20[0] = in_XMM1_Bd;
          auVar20[2] = in_XMM1_Bf;
          auVar20[3] = in_XMM1_Bg;
          auVar20[4] = in_XMM1_Bh;
          auVar20[5] = in_XMM1_Bi;
          auVar20[6] = in_XMM1_Bj;
          auVar20[7] = in_XMM1_Bk;
          auVar20[8] = in_XMM1_Bl;
          auVar20[9] = in_XMM1_Bm;
          auVar20[10] = in_XMM1_Bn;
          auVar20[0xb] = in_XMM1_Bo;
          auVar20[0xc] = in_XMM1_Bp;
          auVar18[1] = in_XMM1_Bf;
          auVar18[0] = in_XMM1_Be;
          auVar18[2] = in_XMM1_Bg;
          auVar18[3] = in_XMM1_Bh;
          auVar18[4] = in_XMM1_Bi;
          auVar18[5] = in_XMM1_Bj;
          auVar18[6] = in_XMM1_Bk;
          auVar18[7] = in_XMM1_Bl;
          auVar18[8] = in_XMM1_Bm;
          auVar18[9] = in_XMM1_Bn;
          auVar18[10] = in_XMM1_Bo;
          auVar18[0xb] = in_XMM1_Bp;
          auVar16[1] = in_XMM1_Bg;
          auVar16[0] = in_XMM1_Bf;
          auVar16[2] = in_XMM1_Bh;
          auVar16[3] = in_XMM1_Bi;
          auVar16[4] = in_XMM1_Bj;
          auVar16[5] = in_XMM1_Bk;
          auVar16[6] = in_XMM1_Bl;
          auVar16[7] = in_XMM1_Bm;
          auVar16[8] = in_XMM1_Bn;
          auVar16[9] = in_XMM1_Bo;
          auVar16[10] = in_XMM1_Bp;
          uVar28 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar22 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar7 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          name = name + uVar7;
          cVar2 = pcVar30[uVar7];
          pcVar30 = pcVar30 + uVar7;
        }
      } while (pcVar30 != pcVar4 + sVar25);
      uVar29 = 1;
    }
  }
  else {
    sVar25 = (s->m_id).type_hash;
    if (sVar25 == 0) {
      bVar23 = std::type_index::operator==(&(s->m_id).type_idx,&(this->m_id).type_idx);
      if (bVar23) goto LAB_00178a38;
    }
    else if (sVar25 == (this->m_id).type_hash) goto LAB_00178a38;
LAB_00178c40:
    uVar29 = 0;
  }
  return (bool)uVar29;
}

Assistant:

bool operator==(const structure &s) const
		{
			if (s.m_id != m_id)
				return false;
			if (!m_shadow && m_data->exist("equal"))
				return invoke(m_data->get_var("equal"), var::make<structure>(this),
				              var::make<structure>(&s)).const_val<bool>();
			else {
				for (auto &it: *m_data)
					if (it.first != "parent" && s.m_data->get_var(it.first) != m_data->get_var_by_id(it.second))
						return false;
				return true;
			}
		}